

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonetree.h
# Opt level: O1

void __thiscall
asmjit::v1_14::ZoneTree<asmjit::v1_14::JitAllocatorBlock>::
insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
          (ZoneTree<asmjit::v1_14::JitAllocatorBlock> *this,JitAllocatorBlock *node,
          Compare<(asmjit::v1_14::Support::SortOrder)0> *cmp)

{
  long *plVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  bool bVar5;
  byte bVar6;
  undefined8 uVar7;
  size_t sVar8;
  size_t sVar9;
  undefined7 uVar10;
  uint uVar11;
  JitAllocatorBlock *pJVar12;
  JitAllocatorBlock *pJVar13;
  CpuInfo *pCVar14;
  JitAllocatorBlock *pJVar15;
  JitAllocatorBlock *pJVar16;
  ulong uVar17;
  uint extraout_EDX;
  ulong uVar18;
  byte *pbVar19;
  ulong uVar20;
  ulong *puVar21;
  ZoneListNode<asmjit::v1_14::JitAllocatorBlock> *__s;
  ulong uVar22;
  ulong uVar23;
  JitAllocatorBlock *pJVar24;
  uint uVar25;
  byte *pbVar26;
  uint uVar27;
  void *pvVar28;
  ulong uVar29;
  ulong *puVar30;
  ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> *pZVar31;
  ZoneTreeNode *save;
  ulong *puVar32;
  ZoneTreeNode head;
  undefined8 uStack_b0;
  byte *pbStack_a8;
  ulong uStack_a0;
  void *pvStack_98;
  JitAllocatorPool *pJStack_90;
  undefined1 local_48 [24];
  
  if (*(ulong *)node < 2) {
    if (*(long *)&node->field_0x8 != 0) goto LAB_00121d29;
    if (*(ulong *)node == 0) {
      pJVar16 = *(JitAllocatorBlock **)this;
      if (pJVar16 == (JitAllocatorBlock *)0x0) {
        *(JitAllocatorBlock **)this = node;
      }
      else {
        pJVar12 = (JitAllocatorBlock *)local_48;
        local_48._0_8_ = 0;
        local_48._8_8_ = pJVar16;
        *(undefined8 *)node = 1;
        pJVar13 = (JitAllocatorBlock *)0x0;
        uVar29 = 0;
        pJVar24 = (JitAllocatorBlock *)0x0;
        uVar23 = 0;
        while( true ) {
          if (pJVar16 == (JitAllocatorBlock *)0x0) {
            *(ulong *)(&pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar23 * 8)
                 = (ulong)((uint)*(undefined8 *)
                                  (&pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                  uVar23 * 8) & 1) | (ulong)node;
            pJVar15 = node;
          }
          else {
            pbVar26 = (byte *)(*(ulong *)pJVar16 & 0xfffffffffffffffe);
            pJVar15 = pJVar16;
            if ((((pbVar26 != (byte *)0x0) && ((*pbVar26 & 1) != 0)) &&
                (*(byte **)&pJVar16->field_0x8 != (byte *)0x0)) &&
               ((**(byte **)&pJVar16->field_0x8 & 1) != 0)) {
              *(ulong *)pJVar16 = *(ulong *)pJVar16 | 1;
              *pbVar26 = *pbVar26 & 0xfe;
              **(ulong **)&pJVar16->field_0x8 = **(ulong **)&pJVar16->field_0x8 & 0xfffffffffffffffe
              ;
            }
          }
          if (((pJVar24 != (JitAllocatorBlock *)0x0) &&
              (((undefined1  [104])*pJVar15 & (undefined1  [104])0x1) != (undefined1  [104])0x0)) &&
             (((byte)pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> & 1) != 0)) {
            pJVar16 = *(JitAllocatorBlock **)&pJVar12->field_0x8;
            uVar18 = (ulong)(uVar29 == 0);
            bVar5 = uVar29 != 0;
            uVar17 = (ulong)bVar5;
            pbVar26 = (byte *)(*(ulong *)(&pJVar13->
                                           super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                         uVar17 * 8) & 0xfffffffffffffffe);
            if (pJVar15 ==
                (JitAllocatorBlock *)
                (*(ulong *)(&pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                           uVar29 * 8) & 0xfffffffffffffffe)) {
              puVar32 = (ulong *)(pbVar26 + uVar18 * 8);
              uVar29 = (ulong)((uint)*(ulong *)(&pJVar13->
                                                 super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>
                                               + uVar17 * 8) & 1) | *puVar32 & 0xfffffffffffffffe;
            }
            else {
              pbVar19 = (byte *)(*(ulong *)(pbVar26 + (ulong)(uVar29 == 0) * 8) & 0xfffffffffffffffe
                                );
              uVar25 = (uint)bVar5 * 8;
              *(ulong *)(pbVar26 + (ulong)(uVar29 == 0) * 8) =
                   (ulong)((uint)*(ulong *)(pbVar26 + (ulong)(uVar29 == 0) * 8) & 1) |
                   *(ulong *)(pbVar19 + uVar25) & 0xfffffffffffffffe;
              *(ulong *)(pbVar19 + uVar25) =
                   (ulong)((uint)*(undefined8 *)(pbVar19 + uVar25) & 1) | (ulong)pbVar26;
              *pbVar26 = *pbVar26 | 1;
              *pbVar19 = *pbVar19 & 0xfe;
              uVar29 = (ulong)((uint)*(undefined8 *)
                                      (&pJVar13->
                                        super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                      uVar25) & 1);
              *(byte **)(&pJVar13->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar25) =
                   pbVar19 + uVar29;
              puVar32 = (ulong *)(pbVar19 + uVar18 * 8);
              uVar29 = *puVar32 & 0xfffffffffffffffe | uVar29;
              pbVar26 = pbVar19;
            }
            *(ulong *)(&pJVar13->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar17 * 8)
                 = uVar29;
            *puVar32 = (ulong)((uint)*puVar32 & 1) | (ulong)pJVar13;
            pJVar13->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
                 (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
                 ((byte)pJVar13->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> | 1);
            uVar29 = (ulong)(pJVar13 == pJVar16);
            *pbVar26 = *pbVar26 & 0xfe;
            *(ulong *)(&pJVar12->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar29 * 8)
                 = (ulong)((uint)*(undefined8 *)
                                  (&pJVar12->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                  uVar29 * 8) & 1) | (ulong)pbVar26;
          }
          if (pJVar15 == node) break;
          uVar18 = (ulong)((pJVar15->_mapping).rx < (node->_mapping).rx);
          if (pJVar13 != (JitAllocatorBlock *)0x0) {
            pJVar12 = pJVar13;
          }
          pJVar16 = (JitAllocatorBlock *)
                    (*(ulong *)(&pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                               uVar18 * 8) & 0xfffffffffffffffe);
          pJVar13 = pJVar24;
          uVar29 = uVar23;
          pJVar24 = pJVar15;
          uVar23 = uVar18;
        }
        *(undefined8 *)this = local_48._8_8_;
        *(ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> *)local_48._8_8_ =
             (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
             ((byte)*(ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> *)local_48._8_8_ & 0xfe);
      }
      return;
    }
  }
  else {
    insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
LAB_00121d29:
    insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
  }
  insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
  pJVar16 = (JitAllocatorBlock *)&uStack_b0;
  uStack_b0._0_1_ = (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)0x0;
  uStack_b0._1_7_ = 0;
  pJStack_90 = (JitAllocatorPool *)this;
  pbVar26 = *(byte **)this;
  pbStack_a8 = pbVar26;
  if (pbVar26 < (byte *)0x2) {
    pJVar12 = (JitAllocatorBlock *)0x0;
    pJVar13 = (JitAllocatorBlock *)0x0;
    pJVar24 = (JitAllocatorBlock *)0x0;
  }
  else {
    pZVar31 = (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> *)&pbStack_a8;
    pvVar28 = (node->_mapping).rx;
    pJVar13 = (JitAllocatorBlock *)0x0;
    pJVar12 = (JitAllocatorBlock *)0x0;
    pvStack_98 = pvVar28;
    uVar29 = 1;
    pJVar16 = (JitAllocatorBlock *)&uStack_b0;
    pJVar15 = (JitAllocatorBlock *)0x0;
    do {
      pJVar24 = pJVar16;
      pJVar16 = (JitAllocatorBlock *)((ulong)pbVar26 & 0xfffffffffffffffe);
      pvVar3 = (pJVar16->_mapping).rx;
      uVar25 = (uint)(pvVar28 < pvVar3) - (uint)(pvVar3 < pvVar28);
      uVar23 = (ulong)(uVar25 >> 0x1f);
      if (pJVar16 == node) {
        pJVar13 = pJVar16;
        pJVar12 = pJVar15;
      }
      if (((pJVar16 == (JitAllocatorBlock *)0x0) ||
          (((byte)pJVar16->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> & 1) == 0)) &&
         ((this = (ZoneTree<asmjit::v1_14::JitAllocatorBlock> *)
                  (*(ulong *)(&pJVar16->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                             uVar23 * 8) & 0xfffffffffffffffe),
          (JitAllocatorPool *)this == (JitAllocatorPool *)0x0 ||
          (((byte)((JitAllocatorPool *)this)->blocks & 1) == 0)))) {
        uVar18 = (ulong)(~uVar25 >> 0x1f);
        this = (ZoneTree<asmjit::v1_14::JitAllocatorBlock> *)
               (*(ulong *)(&pJVar16->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                          uVar18 * 8) & 0xfffffffffffffffe);
        if ((JitAllocatorPool *)this == (JitAllocatorPool *)0x0) {
LAB_00121dee:
          uVar18 = (ulong)(uVar29 == 0);
          puVar32 = (ulong *)(*(ulong *)(&pJVar24->
                                          super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                        uVar18 * 8) & 0xfffffffffffffffe);
          if (puVar32 != (ulong *)0x0) {
            this = (ZoneTree<asmjit::v1_14::JitAllocatorBlock> *)
                   (puVar32[uVar18] & 0xfffffffffffffffe);
            if ((((JitAllocatorPool *)this == (JitAllocatorPool *)0x0) ||
                (((byte)((JitAllocatorPool *)this)->blocks & 1) == 0)) &&
               (((byte *)(puVar32[uVar29] & 0xfffffffffffffffe) == (byte *)0x0 ||
                ((*(byte *)(puVar32[uVar29] & 0xfffffffffffffffe) & 1) == 0)))) {
              pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
                   (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
                   ((byte)pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> & 0xfe);
              *(byte *)puVar32 = (byte)*puVar32 | 1;
              pJVar16->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
                   (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
                   ((byte)pJVar16->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> | 1);
            }
            else {
              uVar17 = (ulong)(pJVar24 == *(JitAllocatorBlock **)&pJVar15->field_0x8);
              pbVar26 = (byte *)(puVar32[uVar29] & 0xfffffffffffffffe);
              if ((pbVar26 == (byte *)0x0) || ((*pbVar26 & 1) == 0)) {
                puVar30 = (ulong *)(*(ulong *)(&pJVar15->
                                                super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>
                                              + uVar17 * 8) & 0xfffffffffffffffe);
                if (((JitAllocatorPool *)this != (JitAllocatorPool *)0x0) &&
                   (((byte)((JitAllocatorPool *)this)->blocks & 1) != 0)) {
                  puVar21 = puVar32 + uVar29;
                  uVar22 = (ulong)pbVar26 |
                           (ulong)((uint)*(ulong *)(&pJVar24->
                                                  super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>
                                                  + uVar18 * 8) & 1);
                  puVar30 = puVar32;
                  goto LAB_00121f3a;
                }
              }
              else {
                uStack_a0 = (ulong)(uVar29 != 0);
                puVar30 = (ulong *)(puVar32[uStack_a0] & 0xfffffffffffffffe);
                uVar20 = (ulong)((uint)(uVar29 == 0) * 8);
                puVar32[uStack_a0] =
                     (ulong)((uint)puVar32[uStack_a0] & 1) |
                     *(ulong *)((long)puVar30 + uVar20) & 0xfffffffffffffffe;
                *(ulong *)((long)puVar30 + uVar20) =
                     (ulong)((uint)*(undefined8 *)((long)puVar30 + uVar20) & 1) | (ulong)puVar32;
                *(byte *)puVar32 = (byte)*puVar32 | 1;
                *(byte *)puVar30 = (byte)*puVar30 & 0xfe;
                uVar22 = (ulong)((uint)*(undefined8 *)
                                        (&pJVar24->
                                          super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                        uVar20) & 1);
                *(byte **)(&pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar20)
                     = (byte *)(uVar22 + (long)puVar30);
                puVar21 = puVar30 + uVar29;
                uVar22 = *puVar21 & 0xfffffffffffffffe | uVar22;
LAB_00121f3a:
                *(ulong *)(&pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                          uVar18 * 8) = uVar22;
                *puVar21 = (ulong)((uint)*puVar21 & 1) | (ulong)pJVar24;
                pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
                     (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
                     ((byte)pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> | 1);
                *(byte *)puVar30 = (byte)*puVar30 & 0xfe;
                *(ulong *)(&pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                          uVar17 * 8) =
                     (ulong)((uint)*(undefined8 *)
                                    (&pJVar15->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>
                                    + uVar17 * 8) & 1) | (ulong)puVar30;
              }
              pJVar16->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
                   (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
                   ((byte)pJVar16->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> | 1);
              uVar29 = *puVar30;
              *puVar30 = uVar29 | 1;
              pbVar26 = (byte *)(uVar29 & 0xfffffffffffffffe);
              *pbVar26 = *pbVar26 & 0xfe;
              this = (ZoneTree<asmjit::v1_14::JitAllocatorBlock> *)puVar30[1];
              *(ulong *)this = *(ulong *)this & 0xfffffffffffffffe;
              pvVar28 = pvStack_98;
            }
          }
        }
        else if (((byte)((JitAllocatorPool *)this)->blocks & 1) == 0) {
          if (((JitAllocatorPool *)this == (JitAllocatorPool *)0x0) ||
             (((byte)((JitAllocatorPool *)this)->blocks & 1) == 0)) goto LAB_00121dee;
        }
        else {
          pJVar24 = (JitAllocatorBlock *)
                    (*(ulong *)(&pJVar16->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                               uVar18 * 8) & 0xfffffffffffffffe);
          *(ulong *)(&pJVar16->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar18 * 8) =
               (ulong)((uint)*(ulong *)(&pJVar16->
                                         super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                       uVar18 * 8) & 1) |
               *(ulong *)(&pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                         uVar23 * 8) & 0xfffffffffffffffe;
          *(ulong *)(&pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar23 * 8) =
               (ulong)((uint)*(undefined8 *)
                              (&pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                              uVar23 * 8) & 1) | (ulong)pJVar16;
          pJVar16->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
               (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
               ((byte)pJVar16->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> | 1);
          pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
               (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
               ((byte)pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> & 0xfe);
          this = (ZoneTree<asmjit::v1_14::JitAllocatorBlock> *)
                 ((ulong)((uint)*(byte **)pZVar31 & 1) | (ulong)pJVar24);
          *(ZoneTree<asmjit::v1_14::JitAllocatorBlock> **)pZVar31 = this;
        }
      }
      pZVar31 = &pJVar16->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar23 * 8;
      pbVar26 = *(byte **)pZVar31;
      uVar29 = uVar23;
      pJVar15 = pJVar24;
    } while ((byte *)0x1 < pbVar26);
  }
  if (pJVar13 == (JitAllocatorBlock *)0x0) {
LAB_001220ad:
    remove<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
LAB_001220b2:
    remove<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
  }
  else {
    if (pJVar13 == (JitAllocatorBlock *)&uStack_b0) goto LAB_001220b2;
    if (pJVar16 != (JitAllocatorBlock *)&uStack_b0) {
      this = (ZoneTree<asmjit::v1_14::JitAllocatorBlock> *)
             (ulong)(pJVar16 == *(JitAllocatorBlock **)&pJVar24->field_0x8);
      *(ulong *)(&pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + (long)this * 8) =
           (ulong)((uint)*(undefined8 *)
                          (&pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                          (long)this * 8) & 1) |
           *(ulong *)(&pJVar16->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                     (ulong)(*(ulong *)pJVar16 < 2) * 8) & 0xfffffffffffffffe;
      if (pJVar13 == pJVar16) {
LAB_00122084:
        *(byte **)pJStack_90 = pbStack_a8;
        if (pbStack_a8 != (byte *)0x0) {
          *pbStack_a8 = *pbStack_a8 & 0xfe;
        }
        return;
      }
      if (pJVar13 != pJVar12) {
        pJVar24 = pJVar12;
        if (pJVar12 == (JitAllocatorBlock *)0x0) {
          pJVar24 = (JitAllocatorBlock *)&uStack_b0;
        }
        if (pJVar24 == (JitAllocatorBlock *)&uStack_b0) {
          uVar29 = 1;
        }
        else {
          pJVar15 = (JitAllocatorBlock *)&uStack_b0;
          if (pJVar12 != (JitAllocatorBlock *)0x0) {
            pJVar15 = pJVar12;
          }
          uVar29 = (ulong)((pJVar15->_mapping).rx < (node->_mapping).rx);
        }
        this = *(ZoneTree<asmjit::v1_14::JitAllocatorBlock> **)
                (&pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar29 * 8);
        while (pJVar12 = (JitAllocatorBlock *)((ulong)this & 0xfffffffffffffffe), pJVar13 != pJVar12
              ) {
          if (pJVar12 == (JitAllocatorBlock *)0x0) {
            remove<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
            goto LAB_001220ad;
          }
          uVar29 = (ulong)((pJVar12->_mapping).rx < (node->_mapping).rx);
          pJVar24 = pJVar12;
          this = *(ZoneTree<asmjit::v1_14::JitAllocatorBlock> **)
                  (&pJVar12->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar29 * 8);
        }
        *(ulong *)(&pJVar24->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar29 * 8) =
             (ulong)((uint)this & 1) | (ulong)pJVar16;
        uVar10 = *(undefined7 *)&pJVar13->field_0x1;
        pJVar16->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> =
             pJVar13->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>;
        *(undefined7 *)&pJVar16->field_0x1 = uVar10;
        *(undefined8 *)&pJVar16->field_0x8 = *(undefined8 *)&pJVar13->field_0x8;
        goto LAB_00122084;
      }
      goto LAB_001220bc;
    }
  }
  remove<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
LAB_001220bc:
  remove<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
  uVar25 = (uint)node;
  if (uVar25 == 0) {
    JitAllocatorBlock::markShrunkArea();
  }
  else {
    uVar27 = extraout_EDX - uVar25;
    uVar29 = (ulong)uVar27;
    if (uVar27 != 0) {
      uVar2 = (uint)((JitAllocatorPool *)this)->totalOverheadBytes;
      plVar1 = (long *)(((JitAllocatorPool *)this)->totalAreaSize[0] + 0x30 + (ulong)(uVar2 & 8));
      *plVar1 = *plVar1 - uVar29;
      *(uint *)((long)this + 0x48) = *(int *)((long)this + 0x48) - uVar27;
      uVar27 = *(uint *)&((JitAllocatorPool *)((long)this + 0x48))->field_0xc;
      uVar11 = *(uint *)&((JitAllocatorPool *)((long)this + 0x48))->field_0x8;
      if (uVar25 <= *(uint *)&((JitAllocatorPool *)((long)this + 0x48))->field_0x8) {
        uVar11 = uVar25;
      }
      if (uVar27 <= extraout_EDX) {
        uVar27 = extraout_EDX;
      }
      *(uint *)&((JitAllocatorPool *)((long)this + 0x48))->field_0x8 = uVar11;
      *(uint *)&((JitAllocatorPool *)((long)this + 0x48))->field_0xc = uVar27;
      pJVar16 = ((JitAllocatorPool *)((long)this + 0x48))->cursor;
      uVar23 = ((ulong)node & 0xffffffff) >> 6;
      uVar18 = 0x40 - (ulong)(uVar25 & 0x3f);
      if (uVar29 <= uVar18) {
        uVar18 = uVar29;
      }
      pZVar31 = &pJVar16->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar23 * 8;
      __s = (ZoneListNode<asmjit::v1_14::JitAllocatorBlock> *)(pZVar31 + 8);
      *(ulong *)pZVar31 =
           *(ulong *)pZVar31 &
           ~((0xffffffffffffffffU >> (-(char)uVar18 & 0x3fU)) << (sbyte)(uVar25 & 0x3f));
      uVar17 = uVar29 - uVar18;
      if (0x3f < uVar17) {
        uVar18 = (uVar29 - uVar18) - 0x40;
        uVar29 = uVar18 >> 6;
        memset(__s,0,uVar29 * 8 + 8);
        uVar17 = (ulong)((uint)uVar18 & 0x3f);
        __s = &pJVar16->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock> + (uVar29 + uVar23) * 8
        ;
      }
      if (uVar17 != 0) {
        *(ulong *)__s = *(ulong *)__s & ~(0xffffffffffffffffU >> (-(char)uVar17 & 0x3fU));
      }
      lVar4 = *(long *)&((JitAllocatorPool *)((long)this + 0x48))->blockCount;
      bVar6 = (byte)(extraout_EDX - 1) & 0x3f;
      puVar32 = (ulong *)(lVar4 + (ulong)(extraout_EDX - 1 >> 6) * 8);
      *puVar32 = *puVar32 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      puVar32 = (ulong *)(lVar4 + (ulong)(uVar25 - 1 >> 6) * 8);
      *puVar32 = *puVar32 | 1L << ((byte)(uVar25 - 1) & 0x3f);
      *(uint *)&((JitAllocatorPool *)this)->totalOverheadBytes = uVar2 | 4;
      return;
    }
  }
  JitAllocatorBlock::markShrunkArea();
  Target::Target((Target *)this);
  *(undefined ***)this = &PTR__JitRuntime_00177338;
  JitAllocator::JitAllocator
            ((JitAllocator *)((JitAllocatorPool *)this)->totalAreaUsed,(CreateParams *)node);
  ((JitAllocatorPool *)this)->field_0x8 = kHost;
  ((JitAllocatorPool *)this)->field_0x9 = kHost;
  ((JitAllocatorPool *)this)->field_0xa = kHost;
  ((JitAllocatorPool *)this)->field_0xb = kHost;
  ((JitAllocatorPool *)this)->field_0xc = kGNU;
  ((JitAllocatorPool *)this)->field_0xd = kUnknown;
  ((JitAllocatorPool *)this)->field_0xe = kHardFloat;
  ((JitAllocatorPool *)this)->field_0xf = '\0';
  ((JitAllocatorPool *)this)->field_0xd = kJIT;
  pCVar14 = CpuInfo::host();
  uVar7 = *(undefined8 *)(pCVar14 + 0x80);
  sVar8 = *(size_t *)(pCVar14 + 0x88);
  sVar9 = *(size_t *)(pCVar14 + 0x90);
  *(undefined8 *)&((JitAllocatorPool *)this)->cursor = *(undefined8 *)(pCVar14 + 0x78);
  ((JitAllocatorPool *)this)->blockCount = (int)uVar7;
  ((JitAllocatorPool *)this)->granularity = (short)((ulong)uVar7 >> 0x20);
  ((JitAllocatorPool *)this)->granularityLog2 = (char)((ulong)uVar7 >> 0x30);
  ((JitAllocatorPool *)this)->emptyBlockCount = (char)((ulong)uVar7 >> 0x38);
  ((JitAllocatorPool *)this)->totalAreaSize[0] = sVar8;
  ((JitAllocatorPool *)this)->totalAreaSize[1] = sVar9;
  return;
}

Assistant:

void insert(NodeT* ASMJIT_NONNULL(node), const CompareT& cmp = CompareT()) noexcept {
    // Node to insert must not contain garbage.
    ASMJIT_ASSERT(!node->hasLeft());
    ASMJIT_ASSERT(!node->hasRight());
    ASMJIT_ASSERT(!node->isRed());

    if (!_root) {
      _root = node;
      return;
    }

    ZoneTreeNode head;           // False root node,
    head._setRight(_root);       // having root on the right.

    ZoneTreeNode* g = nullptr;   // Grandparent.
    ZoneTreeNode* p = nullptr;   // Parent.
    ZoneTreeNode* t = &head;     // Iterator.
    ZoneTreeNode* q = _root;     // Query.

    size_t dir = 0;              // Direction for accessing child nodes.
    size_t last = 0;             // Not needed to initialize, but makes some tools happy.

    node->_makeRed();            // New nodes are always red and violations fixed appropriately.

    // Search down the tree.
    for (;;) {
      if (!q) {
        // Insert new node at the bottom.
        q = node;
        p->_setChild(dir, node);
      }
      else if (_isValidRed(q->_getLeft()) && _isValidRed(q->_getRight())) {
        // Color flip.
        q->_makeRed();
        q->_getLeft()->_makeBlack();
        q->_getRight()->_makeBlack();
      }

      // Fix red violation.
      if (_isValidRed(q) && _isValidRed(p)) {
        ASMJIT_ASSUME(g != nullptr);
        ASMJIT_ASSUME(p != nullptr);
        t->_setChild(t->_getRight() == g,
                     q == p->_getChild(last) ? _singleRotate(g, !last) : _doubleRotate(g, !last));
      }

      // Stop if found.
      if (q == node)
        break;

      last = dir;
      dir = cmp(*static_cast<NodeT*>(q), *static_cast<NodeT*>(node)) < 0;

      // Update helpers.
      if (g) t = g;

      g = p;
      p = q;
      q = q->_getChild(dir);
    }

    // Update root and make it black.
    _root = static_cast<NodeT*>(head._getRight());
    _root->_makeBlack();
  }